

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O3

void __thiscall
WienerDenoiseTest<BitDepthParams<unsigned_char,_8,_false>_>::~WienerDenoiseTest
          (WienerDenoiseTest<BitDepthParams<unsigned_char,_8,_false>_> *this)

{
  void *pvVar1;
  long lVar2;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__WienerDenoiseTest_01011498;
  lVar2 = 0xd0;
  do {
    pvVar1 = *(void **)((long)this->data_ + lVar2 + -0x10);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != 0x88);
  lVar2 = 0x88;
  do {
    pvVar1 = *(void **)((long)this->data_ + lVar2 + -0x10);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != 0x40);
  lVar2 = 0x48;
  do {
    pvVar1 = *(void **)((long)(this->data_ + -1) + lVar2);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != 0);
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

static void SetUpTestSuite() { aom_dsp_rtcd(); }